

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O3

CharacterSet __thiscall ZXing::Content::guessEncoding(Content *this)

{
  CharacterSet CVar1;
  pointer pEVar2;
  long lVar3;
  pointer pEVar4;
  pointer puVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ByteArray input;
  uint8_t *local_38;
  uint8_t *puStack_30;
  long local_28;
  
  local_38 = (uint8_t *)0x0;
  puStack_30 = (uint8_t *)0x0;
  local_28 = 0;
  pEVar2 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pEVar2 == (this->encodings).
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    if (this->hasECI != false) goto LAB_00132f71;
    puVar5 = (this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(*(int *)&(this->bytes).
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (int)puVar5);
  }
  else {
    lVar3 = (long)pEVar2->pos;
    if (lVar3 == 0 || (this->hasECI & 1U) != 0) goto LAB_00132f71;
    puVar5 = (this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_38,0,puVar5,
             puVar5 + lVar3);
LAB_00132f71:
  pEVar2 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (ulong)((long)pEVar4 - (long)pEVar2) >> 3;
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      uVar9 = uVar8 + 1;
      if (uVar9 == (uVar6 & 0xffffffff)) {
        iVar7 = *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
      }
      else {
        iVar7 = pEVar2[uVar8 + 1].pos;
      }
      if ((pEVar2[uVar8].pos != iVar7) && (pEVar2[uVar8].eci == Unknown)) {
        puVar5 = (this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_38,puStack_30,
                   puVar5 + pEVar2[uVar8].pos,puVar5 + iVar7);
        pEVar2 = (this->encodings).
                 super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pEVar4 = (this->encodings).
                 super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = (ulong)((long)pEVar4 - (long)pEVar2) >> 3;
      uVar8 = uVar9;
    } while ((long)uVar9 < (long)(int)uVar6);
  }
  if (local_38 == puStack_30) {
    CVar1 = Unknown;
  }
  else {
    CVar1 = TextDecoder::GuessEncoding(local_38,(long)puStack_30 - (long)local_38,ISO8859_1);
  }
  if (local_38 != (uint8_t *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return CVar1;
}

Assistant:

CharacterSet Content::guessEncoding() const
{
	// assemble all blocks with unknown encoding
	ByteArray input;
	ForEachECIBlock([&](ECI eci, int begin, int end) {
		if (eci == ECI::Unknown)
			input.insert(input.end(), bytes.begin() + begin, bytes.begin() + end);
	});

	if (input.empty())
		return CharacterSet::Unknown;

	return TextDecoder::GuessEncoding(input.data(), input.size(), CharacterSet::ISO8859_1);
}